

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall PrintVisitor::visit(PrintVisitor *this,AssignmentNode *node)

{
  element_type *peVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  PrintVisitor visitor;
  string sStack_58;
  undefined **local_38;
  ostream *local_30;
  int local_28;
  
  poVar2 = this->stream_;
  indent_abi_cxx11_(&sStack_58,this);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_58);
  std::operator<<(poVar2,"AssignmentNode:\n");
  std::__cxx11::string::~string((string *)&sStack_58);
  poVar2 = this->stream_;
  indent_abi_cxx11_(&sStack_58,this);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_58);
  poVar2 = std::operator<<(poVar2,"Name: ");
  poVar2 = std::operator<<(poVar2,(string *)&node->name_);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&sStack_58);
  poVar2 = this->stream_;
  indent_abi_cxx11_(&sStack_58,this);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_58);
  poVar2 = std::operator<<(poVar2,"Operator: ");
  pmVar3 = std::__detail::
           _Map_base<AssignmentOperator,_std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<AssignmentOperator>,_std::hash<AssignmentOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<AssignmentOperator,_std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<AssignmentOperator>,_std::hash<AssignmentOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&AssignmentOperationNames_abi_cxx11_,&node->operator_);
  poVar2 = std::operator<<(poVar2,(string *)pmVar3);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&sStack_58);
  poVar2 = this->stream_;
  local_28 = this->indentation_ + 1;
  local_38 = &PTR__Visitor_00148d30;
  local_30 = poVar2;
  indent_abi_cxx11_(&sStack_58,this);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_58);
  std::operator<<(poVar2,"Value:\n");
  std::__cxx11::string::~string((string *)&sStack_58);
  peVar1 = (node->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_Node)._vptr_Node[2])(peVar1,&local_38);
  return;
}

Assistant:

void PrintVisitor::visit(const AssignmentNode& node)
{
  stream_ << indent() << "AssignmentNode:\n";
  stream_ << indent() << "Name: " << node.getName() << "\n";
  stream_ << indent() << "Operator: " << 
    AssignmentOperationNames.at(node.getOperation()) << "\n";

  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  stream_ << indent() << "Value:\n";
  node.getValue()->accept(visitor);
}